

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMdisk.cpp
# Opt level: O2

int main(int argc_,char **argv_)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  logic_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  LogHelper *pLVar5;
  long *plVar6;
  int extraout_EDX;
  int iVar7;
  int iVar8;
  Range range;
  Range range_00;
  Range range_01;
  Range range_02;
  Range range_03;
  Range range_04;
  Range range_05;
  allocator<char> local_72;
  allocator<char> local_71;
  rep elapsed_ms;
  string local_50;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  bVar1 = ParseCommandLine(argc_,argv_);
  if (!bVar1) {
    return 1;
  }
  iVar7 = optind;
  if (optind < argc_) {
    lVar4 = (long)optind;
    iVar7 = optind + 1;
    optind = iVar7;
    strncpy(opt.szSource,argv_[lVar4],0x1ff);
  }
  iVar8 = iVar7;
  if (iVar7 < argc_) {
    iVar8 = iVar7 + 1;
    optind = iVar8;
    strncpy(opt.szTarget,argv_[iVar7],0x1ff);
  }
  if (iVar8 < argc_) {
    Usage();
switchD_001703cc_caseD_8:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"verify command not yet implemented");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
  uVar2 = GetArgType((string *)&elapsed_ms);
  std::__cxx11::string::~string((string *)&elapsed_ms);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&elapsed_ms,opt.szTarget,(allocator<char> *)&local_50);
  iVar7 = GetArgType((string *)&elapsed_ms);
  std::__cxx11::string::~string((string *)&elapsed_ms);
  switch(opt.command) {
  case 0:
    if ((uVar2 != 0) && (iVar7 != 0)) {
      if (uVar2 == 4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&elapsed_ms,opt.szTarget,(allocator<char> *)&local_50);
        bVar1 = IsTrinity((string *)&elapsed_ms);
        std::__cxx11::string::~string((string *)&elapsed_ms);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&elapsed_ms,opt.szSource,&local_71);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,opt.szTarget,&local_72);
          bVar1 = Image2Trinity((string *)&elapsed_ms,&local_50);
        }
        else {
LAB_0017084f:
          if ((iVar7 != 4) && (iVar7 != 2)) goto LAB_001708f1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&elapsed_ms,opt.szSource,&local_71);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,opt.szTarget,&local_72);
          bVar1 = ImageToImage((string *)&elapsed_ms,&local_50);
        }
      }
      else {
        if (uVar2 == 1) goto LAB_0017084f;
LAB_001708f1:
        if (iVar7 == 2 && uVar2 - 1 < 2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&elapsed_ms,opt.szSource,&local_71);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,opt.szTarget,&local_72);
          bVar1 = Hdd2Hdd((string *)&elapsed_ms,&local_50);
        }
        else if (iVar7 == 4 && uVar2 == 3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&elapsed_ms,opt.szSource,&local_71);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,opt.szTarget,&local_72);
          bVar1 = Hdd2Boot((string *)&elapsed_ms,&local_50);
        }
        else if (iVar7 == 3 && uVar2 == 4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&elapsed_ms,opt.szSource,&local_71);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,opt.szTarget,&local_72);
          bVar1 = Boot2Hdd((string *)&elapsed_ms,&local_50);
        }
        else {
          if ((uVar2 != 3) || (iVar7 != 3)) break;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&elapsed_ms,opt.szSource,&local_71);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,opt.szTarget,&local_72);
          bVar1 = Boot2Boot((string *)&elapsed_ms,&local_50);
        }
      }
LAB_00170bd7:
      std::__cxx11::string::~string((string *)&local_50);
LAB_00170a52:
      std::__cxx11::string::~string((string *)&elapsed_ms);
LAB_00170a5c:
      uVar2 = (uint)(bVar1 ^ 1);
      goto LAB_00170a64;
    }
    break;
  case 1:
    if (((uVar2 != 0) && (iVar7 == 0)) && ((uVar2 == 4 || (uVar2 == 1)))) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
      range_00.head_begin = opt.range.head_begin;
      range_00.head_end = opt.range.head_end;
      range_00.cyl_begin = opt.range.cyl_begin;
      range_00.cyl_end = opt.range.cyl_end;
      bVar1 = ScanImage((string *)&elapsed_ms,range_00);
      goto LAB_00170a52;
    }
    break;
  case 2:
    if ((uVar2 != 0) && (iVar7 == 0)) {
      if (uVar2 == 4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
        range_03.head_begin = opt.range.head_begin;
        range_03.head_end = opt.range.head_end;
        range_03.cyl_begin = opt.range.cyl_begin;
        range_03.cyl_end = opt.range.cyl_end;
        FormatImage((string *)&elapsed_ms,range_03);
      }
      else if (uVar2 == 3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
        FormatBoot((string *)&elapsed_ms);
      }
      else {
        if (uVar2 != 2) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
        FormatHdd((string *)&elapsed_ms);
      }
      std::__cxx11::string::~string((string *)&elapsed_ms);
      bVar1 = false;
      goto LAB_00170a5c;
    }
    break;
  case 3:
    if (iVar7 == 0) {
      if (uVar2 != 0) {
        if (uVar2 < 3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
          bVar1 = ListRecords((string *)&elapsed_ms);
        }
        else {
          if (uVar2 != 4) break;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
          bVar1 = DirImage((string *)&elapsed_ms);
        }
        goto LAB_00170a52;
      }
      bVar1 = ListDrives(opt.verbose);
      goto LAB_00170a5c;
    }
    break;
  case 4:
    if ((uVar2 != 0) && (iVar7 == 0)) {
      if (uVar2 - 1 < 2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
        range.head_begin = opt.range.head_begin;
        range.head_end = opt.range.head_end;
        range.cyl_begin = opt.range.cyl_begin;
        range.cyl_end = opt.range.cyl_end;
        bVar1 = ViewHdd((string *)&elapsed_ms,range);
      }
      else if (uVar2 == 3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
        range_02.head_begin = opt.range.head_begin;
        range_02.head_end = opt.range.head_end;
        range_02.cyl_begin = opt.range.cyl_begin;
        range_02.cyl_end = opt.range.cyl_end;
        bVar1 = ViewBoot((string *)&elapsed_ms,range_02);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
        range_04.head_begin = opt.range.head_begin;
        range_04.head_end = opt.range.head_end;
        range_04.cyl_begin = opt.range.cyl_begin;
        range_04.cyl_end = opt.range.cyl_end;
        bVar1 = ViewImage((string *)&elapsed_ms,range_04);
      }
      goto LAB_00170a52;
    }
    break;
  case 5:
    if ((uVar2 != 0) && (iVar7 == 0)) {
      if (uVar2 - 1 < 2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
        bVar1 = HddInfo((string *)&elapsed_ms,opt.verbose);
      }
      else {
        if (uVar2 != 4) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
        bVar1 = ImageInfo((string *)&elapsed_ms);
      }
      goto LAB_00170a52;
    }
    break;
  case 6:
    if ((uVar2 != 0) && (iVar7 == 0)) {
      if (uVar2 == 4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
        bVar1 = DirImage((string *)&elapsed_ms);
      }
      else {
        if (uVar2 != 2) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
        bVar1 = ListRecords((string *)&elapsed_ms);
      }
      goto LAB_00170a52;
    }
    break;
  case 7:
    if ((uVar2 == 4) && (iVar7 == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
      bVar1 = DiskRpm((string *)&elapsed_ms);
      goto LAB_00170a52;
    }
    break;
  case 8:
    goto switchD_001703cc_caseD_8;
  case 9:
    if ((uVar2 != 0) && (iVar7 == 0)) {
      opt.nosig = 1;
      if (uVar2 == 2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
        bVar1 = FormatHdd((string *)&elapsed_ms);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
        bVar1 = IsRecord((string *)&elapsed_ms,(int *)0x0);
        std::__cxx11::string::~string((string *)&elapsed_ms);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
          bVar1 = FormatRecord((string *)&elapsed_ms);
        }
        else {
          if (uVar2 != 4) break;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
          range_05.head_begin = opt.range.head_begin;
          range_05.head_end = opt.range.head_end;
          range_05.cyl_begin = opt.range.cyl_begin;
          range_05.cyl_end = opt.range.cyl_end;
          bVar1 = UnformatImage((string *)&elapsed_ms,range_05);
        }
      }
      goto LAB_00170a52;
    }
    break;
  case 10:
    if (iVar7 == 0 && uVar2 == 0) {
      bVar1 = true;
      LongVersion();
      goto LAB_00170a5c;
    }
    break;
  case 0xb:
    if (uVar2 == 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
      bVar1 = IsHddImage((string *)&elapsed_ms);
      lVar4 = opt.sectors;
      if (bVar1) {
        std::__cxx11::string::~string((string *)&elapsed_ms);
        if ((iVar7 != 0) || (lVar4 != -1)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&elapsed_ms,opt.szSource,&local_71);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,opt.szTarget,&local_72);
          iVar7 = util::str_value<int>(&local_50);
          bVar1 = CreateHddImage((string *)&elapsed_ms,iVar7);
          goto LAB_00170bd7;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&elapsed_ms);
      }
    }
    else if (((uVar2 != 0) && (uVar2 == 4)) && (iVar7 == 0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&elapsed_ms,opt.szSource,(allocator<char> *)&local_50);
      range_01.head_begin = opt.range.head_begin;
      range_01.head_end = opt.range.head_end;
      range_01.cyl_begin = opt.range.cyl_begin;
      range_01.cyl_end = opt.range.cyl_end;
      bVar1 = CreateImage((string *)&elapsed_ms,range_01);
      goto LAB_00170a52;
    }
  }
  iVar7 = Usage();
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&elapsed_ms);
  if (extraout_EDX == 5) {
    t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        __cxa_begin_catch(iVar7);
    pLVar5 = util::operator<<((LogHelper *)&util::cout,(char (*) [8])"Error: ");
    pLVar5 = util::operator<<(pLVar5,RED);
    pLVar5 = util::operator<<(pLVar5,t);
    pLVar5 = util::operator<<(pLVar5,none);
    elapsed_ms = CONCAT71(elapsed_ms._1_7_,10);
    util::operator<<(pLVar5,(char *)&elapsed_ms);
  }
  else if (extraout_EDX == 4) {
    plVar6 = (long *)__cxa_begin_catch(iVar7);
    pLVar5 = util::operator<<((LogHelper *)&util::cout,RED);
    pLVar5 = util::operator<<(pLVar5,(char (*) [8])"Error: ");
    elapsed_ms = (**(code **)(*plVar6 + 0x10))(plVar6);
    pLVar5 = util::operator<<(pLVar5,(char **)&elapsed_ms);
    pLVar5 = util::operator<<(pLVar5,none);
    local_50._M_dataplus._M_p._0_1_ = 10;
    util::operator<<(pLVar5,(char *)&local_50);
  }
  else if (extraout_EDX == 3) {
    plVar6 = (long *)__cxa_begin_catch(iVar7);
    pLVar5 = util::operator<<((LogHelper *)&util::cout,RED);
    pLVar5 = util::operator<<(pLVar5,(char (*) [8])"Error: ");
    elapsed_ms = (**(code **)(*plVar6 + 0x10))(plVar6);
    pLVar5 = util::operator<<(pLVar5,(char **)&elapsed_ms);
    pLVar5 = util::operator<<(pLVar5,none);
    local_50._M_dataplus._M_p._0_1_ = 10;
    util::operator<<(pLVar5,(char *)&local_50);
  }
  else if (extraout_EDX == 2) {
    plVar6 = (long *)__cxa_begin_catch(iVar7);
    pLVar5 = util::operator<<((LogHelper *)&util::cout,RED);
    pLVar5 = util::operator<<(pLVar5,(char (*) [8])"Error: ");
    elapsed_ms = (**(code **)(*plVar6 + 0x10))(plVar6);
    pLVar5 = util::operator<<(pLVar5,(char **)&elapsed_ms);
    pLVar5 = util::operator<<(pLVar5,none);
    local_50._M_dataplus._M_p._0_1_ = 10;
    util::operator<<(pLVar5,(char *)&local_50);
  }
  else {
    if (extraout_EDX != 1) {
      _Unwind_Resume(iVar7);
    }
    plVar6 = (long *)__cxa_begin_catch(iVar7);
    pLVar5 = util::operator<<((LogHelper *)&util::cout,RED);
    pLVar5 = util::operator<<(pLVar5,(char (*) [8])"Error: ");
    elapsed_ms = (**(code **)(*plVar6 + 0x10))(plVar6);
    pLVar5 = util::operator<<(pLVar5,(char **)&elapsed_ms);
    pLVar5 = util::operator<<(pLVar5,none);
    local_50._M_dataplus._M_p._0_1_ = 10;
    util::operator<<(pLVar5,(char *)&local_50);
  }
  __cxa_end_catch();
  uVar2 = 1;
LAB_00170a64:
  if (opt.time != 0) {
    lVar4 = std::chrono::_V2::system_clock::now();
    elapsed_ms = (lVar4 - lVar3) / 1000000;
    pLVar5 = util::operator<<((LogHelper *)&util::cout,(char (*) [15])"Elapsed time: ");
    pLVar5 = util::operator<<(pLVar5,&elapsed_ms);
    util::operator<<(pLVar5,(char (*) [4])"ms\n");
  }
  pLVar5 = util::operator<<((LogHelper *)&util::cout,none);
  util::operator<<(pLVar5,(char (*) [1])0x1a7fd1);
  std::ofstream::close();
  return uVar2;
}

Assistant:

int main(int argc_, char* argv_[])
{
    auto start_time = std::chrono::system_clock::now();

#ifdef _WIN32
#ifdef _DEBUG
    _CrtSetDbgFlag(_CrtSetDbgFlag(_CRTDBG_REPORT_FLAG) | _CRTDBG_LEAK_CHECK_DF);
#endif

    SetUnhandledExceptionFilter(CrashDumpUnhandledExceptionFilter);

#ifndef _DEBUG
    // Check if we've been run from GUI mode with no arguments
    if (!IsConsoleWindow() && util::is_stdout_a_tty() && argc_ == 1)
    {
        FreeConsole();

        char szPath[MAX_PATH];
        GetModuleFileName(GetModuleHandle(NULL), szPath, ARRAYSIZE(szPath));

        auto strCommand = std::string("/k \"") + szPath + "\" --help";
        GetEnvironmentVariable("COMSPEC", szPath, ARRAYSIZE(szPath));

        auto ret = static_cast<int>(reinterpret_cast<ULONG_PTR>(
            ShellExecute(NULL, "open", szPath, strCommand.c_str(), NULL, SW_NORMAL)));

        // Fall back on the old message if it failed
        if (ret < 32)
            MessageBox(nullptr, "I'm a console-mode utility, please run me from a Command Prompt!", "SAMdisk", MB_OK | MB_ICONSTOP);

        return 0;
    }
#endif // _DEBUG
#endif // _WIN32

    bool f = false;

    try
    {
        if (!ParseCommandLine(argc_, argv_))
            return 1;

        // Read at most two non-option command-line arguments
        if (optind < argc_) strncpy(opt.szSource, argv_[optind++], arraysize(opt.szSource) - 1);
        if (optind < argc_) strncpy(opt.szTarget, argv_[optind++], arraysize(opt.szTarget) - 1);
        if (optind < argc_) Usage();

        int nSource = GetArgType(opt.szSource);
        int nTarget = GetArgType(opt.szTarget);

        switch (opt.command)
        {
        case cmdCopy:
        {
            if (nSource == argNone || nTarget == argNone)
                Usage();

            if (nSource == argDisk && IsTrinity(opt.szTarget))
                f = Image2Trinity(opt.szSource, opt.szTarget);          // file/image -> Trinity
            else if ((nSource == argBlock || nSource == argDisk) && (nTarget == argDisk || nTarget == argHDD /*for .raw*/))
                f = ImageToImage(opt.szSource, opt.szTarget);           // image -> image
            else if ((nSource == argHDD || nSource == argBlock) && nTarget == argHDD)
                f = Hdd2Hdd(opt.szSource, opt.szTarget);                // hdd -> hdd
            else if (nSource == argBootSector && nTarget == argDisk)
                f = Hdd2Boot(opt.szSource, opt.szTarget);               // boot -> file
            else if (nSource == argDisk && nTarget == argBootSector)
                f = Boot2Hdd(opt.szSource, opt.szTarget);               // file -> boot
            else if (nSource == argBootSector && nTarget == argBootSector)
                f = Boot2Boot(opt.szSource, opt.szTarget);              // boot -> boot
            else
                Usage();

            break;
        }

        case cmdList:
        {
            if (nTarget != argNone)
                Usage();

            if (nSource == argNone)
                f = ListDrives(opt.verbose);
            else if (nSource == argHDD || nSource == argBlock)
                f = ListRecords(opt.szSource);
            else if (nSource == argDisk)
                f = DirImage(opt.szSource);
            else
                Usage();

            break;
        }

        case cmdDir:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();
#if 0
            if (nSource == argFloppy)
                f = DirFloppy(opt.szSource);
            else
#endif
                if (nSource == argHDD)
                    f = ListRecords(opt.szSource);
                else if (nSource == argDisk)
                    f = DirImage(opt.szSource);
                else
                    Usage();

            break;
        }

        case cmdScan:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();

            if (nSource == argBlock || nSource == argDisk)
                f = ScanImage(opt.szSource, opt.range);
            else
                Usage();

            break;
        }

        case cmdUnformat:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();

            // Don't write disk signatures during any formatting
            opt.nosig = true;

            if (nSource == argHDD)
                f = FormatHdd(opt.szSource);
            else if (IsRecord(opt.szSource))
                f = FormatRecord(opt.szSource);
            else if (nSource == argDisk)
                f = UnformatImage(opt.szSource, opt.range);
            else
                Usage();

            break;
        }

        case cmdFormat:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();

            if (nSource == argHDD)
                FormatHdd(opt.szSource);
            else if (nSource == argBootSector)
                FormatBoot(opt.szSource);
            else if (nSource == argDisk)
                FormatImage(opt.szSource, opt.range);
            else
                Usage();

            break;
        }

        case cmdVerify:
            throw std::logic_error("verify command not yet implemented");

        case cmdCreate:
        {
            if (nSource == argNone)
                Usage();

            if (nSource == argHDD && IsHddImage(opt.szSource) && (nTarget != argNone || opt.sectors != -1))
                f = CreateHddImage(opt.szSource, util::str_value<int>(opt.szTarget));
            else if (nSource == argDisk && nTarget == argNone)
                f = CreateImage(opt.szSource, opt.range);
            else
                Usage();

            break;
        }

        case cmdInfo:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();

            if (nSource == argHDD || nSource == argBlock)
                f = HddInfo(opt.szSource, opt.verbose);
            else if (nSource == argDisk)
                f = ImageInfo(opt.szSource);
            else
                Usage();

            break;
        }

        case cmdView:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();

            if (nSource == argHDD || nSource == argBlock)
                f = ViewHdd(opt.szSource, opt.range);
            else if (nSource == argBootSector)
                f = ViewBoot(opt.szSource, opt.range);
            else if (nSource == argDisk)
                f = ViewImage(opt.szSource, opt.range);
            else
                Usage();

            break;
        }

        case cmdRpm:
        {
            if (nSource == argNone || nTarget != argNone)
                Usage();

            if (nSource == argDisk)
                f = DiskRpm(opt.szSource);
            else
                Usage();

            break;
        }

        case cmdVersion:
        {
            if (nSource != argNone || nTarget != argNone)
                Usage();

            LongVersion();
            f = true;
            break;
        }

        default:
            Usage();
            break;
        }
    }
    catch (std::string & e)
    {
        util::cout << "Error: " << colour::RED << e << colour::none << '\n';
    }
    catch (util::exception & e)
    {
        util::cout << colour::RED << "Error: " << e.what() << colour::none << '\n';
    }
    catch (std::system_error & e)
    {
        util::cout << colour::RED << "Error: " << e.what() << colour::none << '\n';
    }
    catch (std::logic_error & e)
    {
        util::cout << colour::RED << "Error: " << e.what() << colour::none << '\n';
    }
#ifndef _WIN32
    catch (std::exception & e)
    {
        util::cout << colour::RED << "Error: " << e.what() << colour::none << '\n';
    }
#endif

    if (opt.time)
    {
        auto end_time = std::chrono::system_clock::now();
        auto elapsed_ms = std::chrono::duration_cast<std::chrono::milliseconds>(end_time - start_time).count();
        util::cout << "Elapsed time: " << elapsed_ms << "ms\n";
    }

    util::cout << colour::none << "";
    util::log.close();

    return f ? 0 : 1;
}